

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_3d_bilinear_apply_interpolation_p16
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  long lVar10;
  long lVar11;
  undefined8 *puVar12;
  undefined8 *in_RDX;
  long *in_RSI;
  long lVar13;
  long *in_RDI;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  __m512 _v;
  __m512 v1;
  __m512 v0;
  __m512 v11;
  __m512 v10;
  __m512 v01;
  __m512 v00;
  __m512 value;
  __m512 v111_val;
  __m512 v110_val;
  __m512 v101_val;
  __m512 v100_val;
  __m512 v011_val;
  __m512 v010_val;
  __m512 v001_val;
  __m512 v000_val;
  float *value_ptr;
  int *offset_ptr;
  int i;
  float *offset_value_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outd;
  int outh;
  int outw;
  int channels;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 uStack_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 uStack_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 uStack_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 uStack_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 uStack_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 uStack_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  int local_140c;
  int *local_13c0;
  undefined8 *local_1370;
  int local_1318;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 uStack_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 uStack_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  
  lVar10 = in_RSI[7];
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar11 = in_RSI[6];
  iVar2 = *(int *)((long)in_RSI + 0x34);
  for (local_1318 = 0; local_1318 < (int)lVar10; local_1318 = local_1318 + 1) {
    lVar13 = *in_RDI + in_RDI[8] * (long)local_1318 * in_RDI[2];
    local_1370 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_1318 * in_RSI[2]);
    local_13c0 = (int *)*in_RDX;
    for (local_140c = 0; local_140c < iVar1 * (int)lVar11 * iVar2; local_140c = local_140c + 1) {
      if (*local_13c0 < 0) {
        auVar15 = vbroadcastss_avx512f(ZEXT416(0));
        local_c80 = auVar15._0_8_;
        uStack_c78 = auVar15._8_8_;
        uStack_c70 = auVar15._16_8_;
        uStack_c68 = auVar15._24_8_;
        uStack_c60 = auVar15._32_8_;
        uStack_c58 = auVar15._40_8_;
        uStack_c50 = auVar15._48_8_;
        uStack_c48 = auVar15._56_8_;
        local_1900 = local_c80;
        uStack_18f8 = uStack_c78;
        uStack_18f0 = uStack_c70;
        uStack_18e8 = uStack_c68;
        uStack_18e0 = uStack_c60;
        uStack_18d8 = uStack_c58;
        uStack_18d0 = uStack_c50;
        uStack_18c8 = uStack_c48;
      }
      else {
        puVar12 = (undefined8 *)(lVar13 + (long)*local_13c0 * 4);
        local_1900 = *puVar12;
        uStack_18f8 = puVar12[1];
        uStack_18f0 = puVar12[2];
        uStack_18e8 = puVar12[3];
        uStack_18e0 = puVar12[4];
        uStack_18d8 = puVar12[5];
        uStack_18d0 = puVar12[6];
        uStack_18c8 = puVar12[7];
      }
      if (local_13c0[1] < 0) {
        auVar15 = vbroadcastss_avx512f(ZEXT416(0));
        local_d00 = auVar15._0_8_;
        uStack_cf8 = auVar15._8_8_;
        uStack_cf0 = auVar15._16_8_;
        uStack_ce8 = auVar15._24_8_;
        uStack_ce0 = auVar15._32_8_;
        uStack_cd8 = auVar15._40_8_;
        uStack_cd0 = auVar15._48_8_;
        uStack_cc8 = auVar15._56_8_;
        local_1940 = local_d00;
        uStack_1938 = uStack_cf8;
        uStack_1930 = uStack_cf0;
        uStack_1928 = uStack_ce8;
        uStack_1920 = uStack_ce0;
        uStack_1918 = uStack_cd8;
        uStack_1910 = uStack_cd0;
        uStack_1908 = uStack_cc8;
      }
      else {
        puVar12 = (undefined8 *)(lVar13 + (long)local_13c0[1] * 4);
        local_1940 = *puVar12;
        uStack_1938 = puVar12[1];
        uStack_1930 = puVar12[2];
        uStack_1928 = puVar12[3];
        uStack_1920 = puVar12[4];
        uStack_1918 = puVar12[5];
        uStack_1910 = puVar12[6];
        uStack_1908 = puVar12[7];
      }
      if (local_13c0[2] < 0) {
        auVar15 = vbroadcastss_avx512f(ZEXT416(0));
        local_d80 = auVar15._0_8_;
        uStack_d78 = auVar15._8_8_;
        uStack_d70 = auVar15._16_8_;
        uStack_d68 = auVar15._24_8_;
        uStack_d60 = auVar15._32_8_;
        uStack_d58 = auVar15._40_8_;
        uStack_d50 = auVar15._48_8_;
        uStack_d48 = auVar15._56_8_;
        local_1980 = local_d80;
        uStack_1978 = uStack_d78;
        uStack_1970 = uStack_d70;
        uStack_1968 = uStack_d68;
        uStack_1960 = uStack_d60;
        uStack_1958 = uStack_d58;
        uStack_1950 = uStack_d50;
        uStack_1948 = uStack_d48;
      }
      else {
        puVar12 = (undefined8 *)(lVar13 + (long)local_13c0[2] * 4);
        local_1980 = *puVar12;
        uStack_1978 = puVar12[1];
        uStack_1970 = puVar12[2];
        uStack_1968 = puVar12[3];
        uStack_1960 = puVar12[4];
        uStack_1958 = puVar12[5];
        uStack_1950 = puVar12[6];
        uStack_1948 = puVar12[7];
      }
      if (local_13c0[3] < 0) {
        auVar15 = vbroadcastss_avx512f(ZEXT416(0));
        local_e00 = auVar15._0_8_;
        uStack_df8 = auVar15._8_8_;
        uStack_df0 = auVar15._16_8_;
        uStack_de8 = auVar15._24_8_;
        uStack_de0 = auVar15._32_8_;
        uStack_dd8 = auVar15._40_8_;
        uStack_dd0 = auVar15._48_8_;
        uStack_dc8 = auVar15._56_8_;
        local_19c0 = local_e00;
        uStack_19b8 = uStack_df8;
        uStack_19b0 = uStack_df0;
        uStack_19a8 = uStack_de8;
        uStack_19a0 = uStack_de0;
        uStack_1998 = uStack_dd8;
        uStack_1990 = uStack_dd0;
        uStack_1988 = uStack_dc8;
      }
      else {
        puVar12 = (undefined8 *)(lVar13 + (long)local_13c0[3] * 4);
        local_19c0 = *puVar12;
        uStack_19b8 = puVar12[1];
        uStack_19b0 = puVar12[2];
        uStack_19a8 = puVar12[3];
        uStack_19a0 = puVar12[4];
        uStack_1998 = puVar12[5];
        uStack_1990 = puVar12[6];
        uStack_1988 = puVar12[7];
      }
      if (local_13c0[4] < 0) {
        auVar15 = vbroadcastss_avx512f(ZEXT416(0));
        local_e80 = auVar15._0_8_;
        uStack_e78 = auVar15._8_8_;
        uStack_e70 = auVar15._16_8_;
        uStack_e68 = auVar15._24_8_;
        uStack_e60 = auVar15._32_8_;
        uStack_e58 = auVar15._40_8_;
        uStack_e50 = auVar15._48_8_;
        uStack_e48 = auVar15._56_8_;
        local_1a00 = local_e80;
        uStack_19f8 = uStack_e78;
        uStack_19f0 = uStack_e70;
        uStack_19e8 = uStack_e68;
        uStack_19e0 = uStack_e60;
        uStack_19d8 = uStack_e58;
        uStack_19d0 = uStack_e50;
        uStack_19c8 = uStack_e48;
      }
      else {
        puVar12 = (undefined8 *)(lVar13 + (long)local_13c0[4] * 4);
        local_1a00 = *puVar12;
        uStack_19f8 = puVar12[1];
        uStack_19f0 = puVar12[2];
        uStack_19e8 = puVar12[3];
        uStack_19e0 = puVar12[4];
        uStack_19d8 = puVar12[5];
        uStack_19d0 = puVar12[6];
        uStack_19c8 = puVar12[7];
      }
      if (local_13c0[5] < 0) {
        auVar15 = vbroadcastss_avx512f(ZEXT416(0));
        local_f00 = auVar15._0_8_;
        uStack_ef8 = auVar15._8_8_;
        uStack_ef0 = auVar15._16_8_;
        uStack_ee8 = auVar15._24_8_;
        uStack_ee0 = auVar15._32_8_;
        uStack_ed8 = auVar15._40_8_;
        uStack_ed0 = auVar15._48_8_;
        uStack_ec8 = auVar15._56_8_;
        local_1a40 = local_f00;
        uStack_1a38 = uStack_ef8;
        uStack_1a30 = uStack_ef0;
        uStack_1a28 = uStack_ee8;
        uStack_1a20 = uStack_ee0;
        uStack_1a18 = uStack_ed8;
        uStack_1a10 = uStack_ed0;
        uStack_1a08 = uStack_ec8;
      }
      else {
        puVar12 = (undefined8 *)(lVar13 + (long)local_13c0[5] * 4);
        local_1a40 = *puVar12;
        uStack_1a38 = puVar12[1];
        uStack_1a30 = puVar12[2];
        uStack_1a28 = puVar12[3];
        uStack_1a20 = puVar12[4];
        uStack_1a18 = puVar12[5];
        uStack_1a10 = puVar12[6];
        uStack_1a08 = puVar12[7];
      }
      if (local_13c0[6] < 0) {
        auVar15 = vbroadcastss_avx512f(ZEXT416(0));
        local_f80 = auVar15._0_8_;
        uStack_f78 = auVar15._8_8_;
        uStack_f70 = auVar15._16_8_;
        uStack_f68 = auVar15._24_8_;
        uStack_f60 = auVar15._32_8_;
        uStack_f58 = auVar15._40_8_;
        uStack_f50 = auVar15._48_8_;
        uStack_f48 = auVar15._56_8_;
        local_1a80 = local_f80;
        uStack_1a78 = uStack_f78;
        uStack_1a70 = uStack_f70;
        uStack_1a68 = uStack_f68;
        uStack_1a60 = uStack_f60;
        uStack_1a58 = uStack_f58;
        uStack_1a50 = uStack_f50;
        uStack_1a48 = uStack_f48;
      }
      else {
        puVar12 = (undefined8 *)(lVar13 + (long)local_13c0[6] * 4);
        local_1a80 = *puVar12;
        uStack_1a78 = puVar12[1];
        uStack_1a70 = puVar12[2];
        uStack_1a68 = puVar12[3];
        uStack_1a60 = puVar12[4];
        uStack_1a58 = puVar12[5];
        uStack_1a50 = puVar12[6];
        uStack_1a48 = puVar12[7];
      }
      if (local_13c0[7] < 0) {
        auVar15 = vbroadcastss_avx512f(ZEXT416(0));
        local_1000 = auVar15._0_8_;
        uStack_ff8 = auVar15._8_8_;
        uStack_ff0 = auVar15._16_8_;
        uStack_fe8 = auVar15._24_8_;
        uStack_fe0 = auVar15._32_8_;
        uStack_fd8 = auVar15._40_8_;
        uStack_fd0 = auVar15._48_8_;
        uStack_fc8 = auVar15._56_8_;
        local_1ac0 = local_1000;
        uStack_1ab8 = uStack_ff8;
        uStack_1ab0 = uStack_ff0;
        uStack_1aa8 = uStack_fe8;
        uStack_1aa0 = uStack_fe0;
        uStack_1a98 = uStack_fd8;
        uStack_1a90 = uStack_fd0;
        uStack_1a88 = uStack_fc8;
      }
      else {
        puVar12 = (undefined8 *)(lVar13 + (long)local_13c0[7] * 4);
        local_1ac0 = *puVar12;
        uStack_1ab8 = puVar12[1];
        uStack_1ab0 = puVar12[2];
        uStack_1aa8 = puVar12[3];
        uStack_1aa0 = puVar12[4];
        uStack_1a98 = puVar12[5];
        uStack_1a90 = puVar12[6];
        uStack_1a88 = puVar12[7];
      }
      auVar14 = vbroadcastss_avx512f(ZEXT416((uint)local_13c0[8]));
      auVar9._8_8_ = uStack_18f8;
      auVar9._0_8_ = local_1900;
      auVar9._16_8_ = uStack_18f0;
      auVar9._24_8_ = uStack_18e8;
      auVar9._32_8_ = uStack_18e0;
      auVar9._40_8_ = uStack_18d8;
      auVar9._48_8_ = uStack_18d0;
      auVar9._56_8_ = uStack_18c8;
      auVar8._8_8_ = uStack_18f8;
      auVar8._0_8_ = local_1900;
      auVar8._16_8_ = uStack_18f0;
      auVar8._24_8_ = uStack_18e8;
      auVar8._32_8_ = uStack_18e0;
      auVar8._40_8_ = uStack_18d8;
      auVar8._48_8_ = uStack_18d0;
      auVar8._56_8_ = uStack_18c8;
      auVar15 = vfnmadd213ps_avx512f(auVar14,auVar9,auVar8);
      auVar16._8_8_ = uStack_1938;
      auVar16._0_8_ = local_1940;
      auVar16._16_8_ = uStack_1930;
      auVar16._24_8_ = uStack_1928;
      auVar16._32_8_ = uStack_1920;
      auVar16._40_8_ = uStack_1918;
      auVar16._48_8_ = uStack_1910;
      auVar16._56_8_ = uStack_1908;
      auVar16 = vfmadd213ps_avx512f(auVar14,auVar16,auVar15);
      auVar7._8_8_ = uStack_1978;
      auVar7._0_8_ = local_1980;
      auVar7._16_8_ = uStack_1970;
      auVar7._24_8_ = uStack_1968;
      auVar7._32_8_ = uStack_1960;
      auVar7._40_8_ = uStack_1958;
      auVar7._48_8_ = uStack_1950;
      auVar7._56_8_ = uStack_1948;
      auVar6._8_8_ = uStack_1978;
      auVar6._0_8_ = local_1980;
      auVar6._16_8_ = uStack_1970;
      auVar6._24_8_ = uStack_1968;
      auVar6._32_8_ = uStack_1960;
      auVar6._40_8_ = uStack_1958;
      auVar6._48_8_ = uStack_1950;
      auVar6._56_8_ = uStack_1948;
      auVar15 = vfnmadd213ps_avx512f(auVar14,auVar7,auVar6);
      auVar17._8_8_ = uStack_19b8;
      auVar17._0_8_ = local_19c0;
      auVar17._16_8_ = uStack_19b0;
      auVar17._24_8_ = uStack_19a8;
      auVar17._32_8_ = uStack_19a0;
      auVar17._40_8_ = uStack_1998;
      auVar17._48_8_ = uStack_1990;
      auVar17._56_8_ = uStack_1988;
      auVar17 = vfmadd213ps_avx512f(auVar14,auVar17,auVar15);
      auVar5._8_8_ = uStack_19f8;
      auVar5._0_8_ = local_1a00;
      auVar5._16_8_ = uStack_19f0;
      auVar5._24_8_ = uStack_19e8;
      auVar5._32_8_ = uStack_19e0;
      auVar5._40_8_ = uStack_19d8;
      auVar5._48_8_ = uStack_19d0;
      auVar5._56_8_ = uStack_19c8;
      auVar4._8_8_ = uStack_19f8;
      auVar4._0_8_ = local_1a00;
      auVar4._16_8_ = uStack_19f0;
      auVar4._24_8_ = uStack_19e8;
      auVar4._32_8_ = uStack_19e0;
      auVar4._40_8_ = uStack_19d8;
      auVar4._48_8_ = uStack_19d0;
      auVar4._56_8_ = uStack_19c8;
      auVar15 = vfnmadd213ps_avx512f(auVar14,auVar5,auVar4);
      auVar18._8_8_ = uStack_1a38;
      auVar18._0_8_ = local_1a40;
      auVar18._16_8_ = uStack_1a30;
      auVar18._24_8_ = uStack_1a28;
      auVar18._32_8_ = uStack_1a20;
      auVar18._40_8_ = uStack_1a18;
      auVar18._48_8_ = uStack_1a10;
      auVar18._56_8_ = uStack_1a08;
      auVar18 = vfmadd213ps_avx512f(auVar14,auVar18,auVar15);
      auVar3._8_8_ = uStack_1a78;
      auVar3._0_8_ = local_1a80;
      auVar3._16_8_ = uStack_1a70;
      auVar3._24_8_ = uStack_1a68;
      auVar3._32_8_ = uStack_1a60;
      auVar3._40_8_ = uStack_1a58;
      auVar3._48_8_ = uStack_1a50;
      auVar3._56_8_ = uStack_1a48;
      auVar19._8_8_ = uStack_1a78;
      auVar19._0_8_ = local_1a80;
      auVar19._16_8_ = uStack_1a70;
      auVar19._24_8_ = uStack_1a68;
      auVar19._32_8_ = uStack_1a60;
      auVar19._40_8_ = uStack_1a58;
      auVar19._48_8_ = uStack_1a50;
      auVar19._56_8_ = uStack_1a48;
      auVar19 = vfnmadd213ps_avx512f(auVar14,auVar3,auVar19);
      auVar15._8_8_ = uStack_1ab8;
      auVar15._0_8_ = local_1ac0;
      auVar15._16_8_ = uStack_1ab0;
      auVar15._24_8_ = uStack_1aa8;
      auVar15._32_8_ = uStack_1aa0;
      auVar15._40_8_ = uStack_1a98;
      auVar15._48_8_ = uStack_1a90;
      auVar15._56_8_ = uStack_1a88;
      auVar15 = vfmadd213ps_avx512f(auVar14,auVar15,auVar19);
      auVar19 = vbroadcastss_avx512f(ZEXT416((uint)local_13c0[9]));
      auVar16 = vfnmadd213ps_avx512f(auVar19,auVar16,auVar16);
      auVar17 = vfmadd213ps_avx512f(auVar19,auVar17,auVar16);
      auVar18 = vfnmadd213ps_avx512f(auVar19,auVar18,auVar18);
      auVar15 = vfmadd213ps_avx512f(auVar19,auVar15,auVar18);
      auVar18 = vbroadcastss_avx512f(ZEXT416((uint)local_13c0[10]));
      auVar16 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar16 = vpxord_avx512f(auVar18,auVar16);
      auVar17 = vfmadd213ps_avx512f(auVar16,auVar17,auVar17);
      auVar15 = vfmadd213ps_avx512f(auVar18,auVar15,auVar17);
      local_1840 = auVar15._0_8_;
      uStack_1838 = auVar15._8_8_;
      uStack_1830 = auVar15._16_8_;
      uStack_1828 = auVar15._24_8_;
      uStack_1820 = auVar15._32_8_;
      uStack_1818 = auVar15._40_8_;
      uStack_1810 = auVar15._48_8_;
      uStack_1808 = auVar15._56_8_;
      *local_1370 = local_1840;
      local_1370[1] = uStack_1838;
      local_1370[2] = uStack_1830;
      local_1370[3] = uStack_1828;
      local_1370[4] = uStack_1820;
      local_1370[5] = uStack_1818;
      local_1370[6] = uStack_1810;
      local_1370[7] = uStack_1808;
      local_1370 = local_1370 + 8;
      local_13c0 = local_13c0 + 0xb;
    }
  }
  return;
}

Assistant:

static void gridsample_3d_bilinear_apply_interpolation_p16(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            const int* offset_ptr = (int*)offset_value_ptr;
            const float* value_ptr = offset_value_ptr + 8;

            __m512 v000_val = offset_ptr[0] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[0]) : _mm512_set1_ps(0);
            __m512 v001_val = offset_ptr[1] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[1]) : _mm512_set1_ps(0);
            __m512 v010_val = offset_ptr[2] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[2]) : _mm512_set1_ps(0);
            __m512 v011_val = offset_ptr[3] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[3]) : _mm512_set1_ps(0);

            __m512 v100_val = offset_ptr[4] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[4]) : _mm512_set1_ps(0);
            __m512 v101_val = offset_ptr[5] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[5]) : _mm512_set1_ps(0);
            __m512 v110_val = offset_ptr[6] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[6]) : _mm512_set1_ps(0);
            __m512 v111_val = offset_ptr[7] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[7]) : _mm512_set1_ps(0);

            __m512 value = _mm512_set1_ps(value_ptr[0]);
            __m512 v00 = _mm512_fmadd_ps(v001_val, value, _mm512_fnmadd_ps(v000_val, value, v000_val));
            __m512 v01 = _mm512_fmadd_ps(v011_val, value, _mm512_fnmadd_ps(v010_val, value, v010_val));
            __m512 v10 = _mm512_fmadd_ps(v101_val, value, _mm512_fnmadd_ps(v100_val, value, v100_val));
            __m512 v11 = _mm512_fmadd_ps(v111_val, value, _mm512_fnmadd_ps(v110_val, value, v110_val));

            value = _mm512_set1_ps(value_ptr[1]);
            __m512 v0 = _mm512_fmadd_ps(v01, value, _mm512_fnmadd_ps(v00, value, v00));
            __m512 v1 = _mm512_fmadd_ps(v11, value, _mm512_fnmadd_ps(v10, value, v10));

            value = _mm512_set1_ps(value_ptr[2]);
            __m512 _v = _mm512_fmadd_ps(v1, value, _mm512_fnmadd_ps(v0, value, v0));
            _mm512_storeu_ps(dstptr, _v);

            dstptr += 16;
            offset_value_ptr += 11;
        }
    }
}